

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

int addApplicationPropertiesToAMQPMessage
              (IOTHUB_MESSAGE_HANDLE iothub_message_handle,MESSAGE_HANDLE uamqp_message)

{
  MAP_RESULT MVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  AMQP_VALUE map;
  AMQP_VALUE key;
  AMQP_VALUE value;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  AMQP_VALUE map_value_value;
  AMQP_VALUE map_key_value;
  size_t i;
  LOGGER_LOG l_1;
  AMQP_VALUE uamqp_map;
  LOGGER_LOG l;
  size_t propertyCount;
  char **propertyValues;
  char **propertyKeys;
  MAP_HANDLE properties_map;
  MESSAGE_HANDLE pMStack_18;
  int result;
  MESSAGE_HANDLE uamqp_message_local;
  IOTHUB_MESSAGE_HANDLE iothub_message_handle_local;
  
  l = (LOGGER_LOG)0x0;
  pMStack_18 = uamqp_message;
  uamqp_message_local = (MESSAGE_HANDLE)iothub_message_handle;
  propertyKeys = (char **)IoTHubMessage_Properties(iothub_message_handle);
  MVar1 = Map_GetInternals((MAP_HANDLE)propertyKeys,&propertyValues,(char ***)&propertyCount,
                           (size_t *)&l);
  if (MVar1 == MAP_OK) {
    if (l == (LOGGER_LOG)0x0) {
      properties_map._4_4_ = 0;
    }
    else {
      map = amqpvalue_create_map();
      if (map == (AMQP_VALUE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"addApplicationPropertiesToAMQPMessage",0x15c,1,
                    "Failed to create uAMQP map for the properties.");
        }
        properties_map._4_4_ = 0x15d;
      }
      else {
        for (map_key_value = (AMQP_VALUE)0x0; map_key_value < l;
            map_key_value = (AMQP_VALUE)((long)&map_key_value->type + 1)) {
          key = amqpvalue_create_string(propertyValues[(long)map_key_value]);
          if (key == (AMQP_VALUE)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                        ,"addApplicationPropertiesToAMQPMessage",0x169,1,
                        "Failed to create uAMQP property key name.");
            }
            break;
          }
          value = amqpvalue_create_string(*(char **)(propertyCount + (long)map_key_value * 8));
          if (value == (AMQP_VALUE)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                        ,"addApplicationPropertiesToAMQPMessage",0x170,1,
                        "Failed to create uAMQP property key value.");
            }
            break;
          }
          iVar2 = amqpvalue_set_map_value(map,key,value);
          if (iVar2 != 0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                        ,"addApplicationPropertiesToAMQPMessage",0x177,1,
                        "Failed to set key/value into the the uAMQP property map.");
            }
            break;
          }
          amqpvalue_destroy(value);
          amqpvalue_destroy(key);
        }
        if (map_key_value == (AMQP_VALUE)l) {
          iVar2 = message_set_application_properties(pMStack_18,map);
          if (iVar2 == 0) {
            properties_map._4_4_ = 0;
          }
          else {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                        ,"addApplicationPropertiesToAMQPMessage",0x184,1,
                        "Failed to transfer the message properties to the uAMQP message.");
            }
            properties_map._4_4_ = 0x185;
          }
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                      ,"addApplicationPropertiesToAMQPMessage",0x18e,1,
                      "Failed to set application property into the the uAMQP property map.");
          }
          properties_map._4_4_ = 399;
        }
        amqpvalue_destroy(map);
      }
    }
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"addApplicationPropertiesToAMQPMessage",0x151,1,
                "Failed to get the internals of the property map.");
    }
    properties_map._4_4_ = 0x152;
  }
  return properties_map._4_4_;
}

Assistant:

static int addApplicationPropertiesToAMQPMessage(IOTHUB_MESSAGE_HANDLE iothub_message_handle, MESSAGE_HANDLE uamqp_message)
{
    int result;
    MAP_HANDLE properties_map;
    const char* const* propertyKeys;
    const char* const* propertyValues;
    size_t propertyCount = 0;

    properties_map = IoTHubMessage_Properties(iothub_message_handle);

    if (Map_GetInternals(properties_map, &propertyKeys, &propertyValues, &propertyCount) != MAP_OK)
    {
        LogError("Failed to get the internals of the property map.");
        result = MU_FAILURE;
    }
    else
    {
        if (propertyCount != 0)
        {
            AMQP_VALUE uamqp_map;

            if ((uamqp_map = amqpvalue_create_map()) == NULL)
            {
                LogError("Failed to create uAMQP map for the properties.");
                result = MU_FAILURE;
            }
            else
            {
                size_t i = 0;
                for (i = 0; i < propertyCount; i++)
                {
                    AMQP_VALUE map_key_value = NULL;
                    AMQP_VALUE map_value_value = NULL;

                    if ((map_key_value = amqpvalue_create_string(propertyKeys[i])) == NULL)
                    {
                        LogError("Failed to create uAMQP property key name.");
                        break;
                    }
                    else
                    {
                        if ((map_value_value = amqpvalue_create_string(propertyValues[i])) == NULL)
                        {
                            LogError("Failed to create uAMQP property key value.");
                            break;
                        }
                        else
                        {
                            if (amqpvalue_set_map_value(uamqp_map, map_key_value, map_value_value) != 0)
                            {
                                LogError("Failed to set key/value into the the uAMQP property map.");
                                break;
                            }
                            amqpvalue_destroy(map_value_value);
                        }
                        amqpvalue_destroy(map_key_value);
                    }
                }

                if (i == propertyCount)
                {
                    if (message_set_application_properties(uamqp_message, uamqp_map) != 0)
                    {
                        LogError("Failed to transfer the message properties to the uAMQP message.");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
                else
                {
                    LogError("Failed to set application property into the the uAMQP property map.");
                    result = MU_FAILURE;
                }
                amqpvalue_destroy(uamqp_map);
            }
        }
        else
        {
            result = 0;
        }
    }
    return result;
}